

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

int __thiscall btSoftBody::generateBendingConstraints(btSoftBody *this,int distance,Material *mat)

{
  undefined1 *puVar1;
  Node *pNVar2;
  Link *pLVar3;
  int *piVar4;
  NodeLinks *pNVar5;
  uint uVar6;
  undefined4 *puVar7;
  int *piVar8;
  uint *puVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  uint *puVar13;
  int iVar14;
  long lVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  undefined4 *puVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  btAlignedObjectArray<NodeLinks> nodeLinks;
  btAlignedObjectArray<NodeLinks> local_78;
  btAlignedObjectArray<int> local_58;
  
  if (distance < 2) {
    return 0;
  }
  iVar12 = (this->m_nodes).m_size;
  uVar25 = (ulong)iVar12;
  puVar7 = (undefined4 *)operator_new__((ulong)(uint)(iVar12 * iVar12) << 2);
  if (0 < (long)uVar25) {
    uVar10 = 0;
    puVar16 = puVar7;
    puVar17 = puVar7;
    do {
      uVar23 = 0;
      puVar21 = puVar16;
      do {
        if (uVar10 == uVar23) {
          puVar7[uVar10 * uVar25 + uVar10] = 0;
        }
        else {
          *puVar21 = 0x7fffffff;
          puVar17[uVar23] = 0x7fffffff;
        }
        uVar23 = uVar23 + 1;
        puVar21 = puVar21 + uVar25;
      } while (uVar25 != uVar23);
      uVar10 = uVar10 + 1;
      puVar17 = puVar17 + uVar25;
      puVar16 = puVar16 + 1;
    } while (uVar10 != uVar25);
  }
  lVar11 = (long)(this->m_links).m_size;
  if (0 < lVar11) {
    pNVar2 = (this->m_nodes).m_data;
    pLVar3 = (this->m_links).m_data;
    lVar15 = 0;
    do {
      iVar18 = (int)((ulong)(*(long *)((long)pLVar3->m_n + lVar15) - (long)pNVar2) >> 3) *
               -0x11111111;
      iVar19 = (int)((ulong)(*(long *)((long)pLVar3->m_n + lVar15 + 8) - (long)pNVar2) >> 3) *
               -0x11111111;
      puVar7[iVar12 * iVar19 + iVar18] = 1;
      puVar7[iVar18 * iVar12 + iVar19] = 1;
      lVar15 = lVar15 + 0x48;
    } while (lVar11 * 0x48 != lVar15);
  }
  if (distance == 2) {
    local_78.m_ownsMemory = true;
    local_78.m_data = (NodeLinks *)0x0;
    local_78.m_size = 0;
    local_78.m_capacity = 0;
    local_58.m_data = (int *)0x0;
    local_58.m_capacity = 0;
    local_58._12_4_ = 0;
    local_58.m_ownsMemory = true;
    local_58._25_7_ = 0;
    local_58._0_4_ = 0;
    local_58.m_size = 0;
    btAlignedObjectArray<NodeLinks>::resize(&local_78,iVar12,(NodeLinks *)&local_58);
    btAlignedObjectArray<int>::~btAlignedObjectArray(&local_58);
    if (0 < (this->m_links).m_size) {
      lVar11 = 0;
      do {
        pNVar5 = local_78.m_data;
        pNVar2 = (this->m_nodes).m_data;
        pLVar3 = (this->m_links).m_data;
        iVar19 = (int)((long)pLVar3[lVar11].m_n[0] - (long)pNVar2 >> 3) * -0x11111111;
        iVar14 = (int)((long)pLVar3[lVar11].m_n[1] - (long)pNVar2 >> 3) * -0x11111111;
        iVar18 = local_78.m_data[iVar19].m_links.m_size;
        uVar10 = (ulong)iVar18;
        if (0 < (long)uVar10) {
          uVar23 = 0;
          do {
            if (local_78.m_data[iVar19].m_links.m_data[uVar23] == iVar14) {
              if (iVar18 != (int)uVar23) goto LAB_001d7fa4;
              break;
            }
            uVar23 = uVar23 + 1;
          } while (uVar10 != uVar23);
        }
        if (iVar18 == local_78.m_data[iVar19].m_links.m_capacity) {
          iVar27 = iVar18 * 2;
          if (iVar18 == 0) {
            iVar27 = 1;
          }
          if (iVar18 < iVar27) {
            if (iVar27 == 0) {
              piVar8 = (int *)0x0;
            }
            else {
              piVar8 = (int *)btAlignedAllocInternal((long)iVar27 << 2,0x10);
              uVar10 = (ulong)(uint)pNVar5[iVar19].m_links.m_size;
            }
            piVar4 = pNVar5[iVar19].m_links.m_data;
            iVar18 = (int)uVar10;
            if (iVar18 < 1) {
              if (piVar4 != (int *)0x0) goto LAB_001d7f35;
            }
            else {
              uVar23 = 0;
              do {
                piVar8[uVar23] = piVar4[uVar23];
                uVar23 = uVar23 + 1;
              } while ((uVar10 & 0xffffffff) != uVar23);
LAB_001d7f35:
              if (pNVar5[iVar19].m_links.m_ownsMemory == true) {
                btAlignedFreeInternal(piVar4);
              }
              iVar18 = pNVar5[iVar19].m_links.m_size;
            }
            pNVar5[iVar19].m_links.m_ownsMemory = true;
            pNVar5[iVar19].m_links.m_data = piVar8;
            pNVar5[iVar19].m_links.m_capacity = iVar27;
          }
        }
        pNVar5[iVar19].m_links.m_data[iVar18] = iVar14;
        piVar8 = &pNVar5[iVar19].m_links.m_size;
        *piVar8 = *piVar8 + 1;
LAB_001d7fa4:
        pNVar5 = local_78.m_data;
        iVar18 = local_78.m_data[iVar14].m_links.m_size;
        uVar10 = (ulong)iVar18;
        if (0 < (long)uVar10) {
          uVar23 = 0;
          do {
            if (local_78.m_data[iVar14].m_links.m_data[uVar23] == iVar19) {
              if (iVar18 != (int)uVar23) goto LAB_001d80a6;
              break;
            }
            uVar23 = uVar23 + 1;
          } while (uVar10 != uVar23);
        }
        if (iVar18 == local_78.m_data[iVar14].m_links.m_capacity) {
          iVar27 = iVar18 * 2;
          if (iVar18 == 0) {
            iVar27 = 1;
          }
          if (iVar18 < iVar27) {
            if (iVar27 == 0) {
              piVar8 = (int *)0x0;
            }
            else {
              piVar8 = (int *)btAlignedAllocInternal((long)iVar27 << 2,0x10);
              uVar10 = (ulong)(uint)pNVar5[iVar14].m_links.m_size;
            }
            piVar4 = pNVar5[iVar14].m_links.m_data;
            iVar18 = (int)uVar10;
            if (iVar18 < 1) {
              if (piVar4 != (int *)0x0) goto LAB_001d804e;
            }
            else {
              uVar23 = 0;
              do {
                piVar8[uVar23] = piVar4[uVar23];
                uVar23 = uVar23 + 1;
              } while ((uVar10 & 0xffffffff) != uVar23);
LAB_001d804e:
              if (pNVar5[iVar14].m_links.m_ownsMemory == true) {
                btAlignedFreeInternal(piVar4);
              }
              iVar18 = pNVar5[iVar14].m_links.m_size;
            }
            pNVar5[iVar14].m_links.m_ownsMemory = true;
            pNVar5[iVar14].m_links.m_data = piVar8;
            pNVar5[iVar14].m_links.m_capacity = iVar27;
          }
        }
        pNVar5[iVar14].m_links.m_data[iVar18] = iVar19;
        piVar8 = &pNVar5[iVar14].m_links.m_size;
        *piVar8 = *piVar8 + 1;
LAB_001d80a6:
        lVar11 = lVar11 + 1;
      } while (lVar11 < (this->m_links).m_size);
    }
    if (0 < (long)local_78.m_size) {
      uVar10 = 0;
      do {
        uVar23 = (ulong)local_78.m_data[uVar10].m_links.m_size;
        if (0 < (long)uVar23) {
          piVar8 = local_78.m_data[uVar10].m_links.m_data;
          uVar22 = 0;
          do {
            iVar18 = piVar8[uVar22];
            uVar24 = (ulong)local_78.m_data[iVar18].m_links.m_size;
            if (0 < (long)uVar24) {
              piVar4 = local_78.m_data[iVar18].m_links.m_data;
              uVar26 = 0;
              do {
                uVar20 = piVar4[uVar26];
                if (uVar10 != uVar20) {
                  uVar6 = puVar7[(int)(iVar12 * uVar20 + iVar18)] +
                          puVar7[iVar12 * iVar18 + (int)uVar10];
                  iVar19 = iVar12 * uVar20 + (int)uVar10;
                  if (uVar6 < (uint)puVar7[iVar19]) {
                    puVar7[uVar10 * uVar25 + (long)(int)uVar20] = uVar6;
                    puVar7[iVar19] = uVar6;
                  }
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 < uVar24);
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 < uVar23);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (long)local_78.m_size);
    }
    btAlignedObjectArray<NodeLinks>::~btAlignedObjectArray(&local_78);
LAB_001d823c:
    if (0 < iVar12) {
      lVar11 = 0x78;
      iVar12 = 0;
      uVar10 = 0;
      uVar23 = uVar25;
      puVar16 = puVar7;
      do {
        uVar22 = uVar10 + 1;
        if (uVar22 < uVar25) {
          uVar24 = 1;
          lVar15 = lVar11;
          do {
            if (puVar16[uVar24] == distance) {
              pNVar2 = (this->m_nodes).m_data;
              appendLink(this,(Node *)((long)&(((Node *)(&pNVar2->m_x + -1))->super_Feature).
                                              super_Element.m_tag + lVar15),pNVar2 + uVar10,mat,
                         false);
              puVar1 = &(this->m_links).m_data[(long)(this->m_links).m_size + -1].field_0x24;
              *puVar1 = *puVar1 | 1;
              iVar12 = iVar12 + 1;
            }
            uVar24 = uVar24 + 1;
            lVar15 = lVar15 + 0x78;
          } while (uVar23 != uVar24);
        }
        puVar16 = puVar16 + uVar25 + 1;
        lVar11 = lVar11 + 0x78;
        uVar23 = uVar23 - 1;
        uVar10 = uVar22;
      } while (uVar22 != uVar25);
      goto LAB_001d8317;
    }
  }
  else if (0 < iVar12) {
    uVar10 = 0;
    puVar16 = puVar7 + 1;
    do {
      puVar9 = puVar7 + uVar25;
      uVar22 = 0;
      puVar17 = puVar7 + 1;
      puVar21 = puVar16;
      uVar23 = uVar25;
      do {
        uVar23 = uVar23 - 1;
        uVar24 = uVar22 + 1;
        if (uVar24 < uVar25) {
          uVar26 = 0;
          puVar13 = puVar9;
          do {
            uVar20 = puVar7[uVar10 + uVar22 * uVar25] + puVar21[uVar26];
            if (uVar20 < (uint)puVar17[uVar26]) {
              *puVar13 = uVar20;
              puVar17[uVar26] = uVar20;
            }
            uVar26 = uVar26 + 1;
            puVar13 = puVar13 + uVar25;
          } while (uVar23 != uVar26);
        }
        puVar17 = puVar17 + uVar25 + 1;
        puVar21 = puVar21 + 1;
        puVar9 = puVar9 + uVar25 + 1;
        uVar22 = uVar24;
      } while (uVar24 != uVar25);
      uVar10 = uVar10 + 1;
      puVar16 = puVar16 + uVar25;
    } while (uVar10 != uVar25);
    goto LAB_001d823c;
  }
  iVar12 = 0;
LAB_001d8317:
  operator_delete__(puVar7);
  return iVar12;
}

Assistant:

int				btSoftBody::generateBendingConstraints(int distance,Material* mat)
{
	int i,j;

	if(distance>1)
	{
		/* Build graph	*/ 
		const int		n=m_nodes.size();
		const unsigned	inf=(~(unsigned)0)>>1;
		unsigned*		adj=new unsigned[n*n];
		

#define IDX(_x_,_y_)	((_y_)*n+(_x_))
		for(j=0;j<n;++j)
		{
			for(i=0;i<n;++i)
			{
				if(i!=j)
				{
					adj[IDX(i,j)]=adj[IDX(j,i)]=inf;
				}
				else
				{
					adj[IDX(i,j)]=adj[IDX(j,i)]=0;
				}
			}
		}
		for( i=0;i<m_links.size();++i)
		{
			const int	ia=(int)(m_links[i].m_n[0]-&m_nodes[0]);
			const int	ib=(int)(m_links[i].m_n[1]-&m_nodes[0]);
			adj[IDX(ia,ib)]=1;
			adj[IDX(ib,ia)]=1;
		}


		//special optimized case for distance == 2
		if (distance == 2)
		{

			btAlignedObjectArray<NodeLinks> nodeLinks;


			/* Build node links */
			nodeLinks.resize(m_nodes.size());

			for( i=0;i<m_links.size();++i)
			{
				const int	ia=(int)(m_links[i].m_n[0]-&m_nodes[0]);
				const int	ib=(int)(m_links[i].m_n[1]-&m_nodes[0]);
				if (nodeLinks[ia].m_links.findLinearSearch(ib)==nodeLinks[ia].m_links.size())
					nodeLinks[ia].m_links.push_back(ib);

				if (nodeLinks[ib].m_links.findLinearSearch(ia)==nodeLinks[ib].m_links.size())
					nodeLinks[ib].m_links.push_back(ia);
			}
			for (int ii=0;ii<nodeLinks.size();ii++)
			{
				int i=ii;

				for (int jj=0;jj<nodeLinks[ii].m_links.size();jj++)
				{
					int k = nodeLinks[ii].m_links[jj];
					for (int kk=0;kk<nodeLinks[k].m_links.size();kk++)
					{
						int j = nodeLinks[k].m_links[kk];
						if (i!=j)
						{
							const unsigned	sum=adj[IDX(i,k)]+adj[IDX(k,j)];
							btAssert(sum==2);
							if(adj[IDX(i,j)]>sum)
							{
								adj[IDX(i,j)]=adj[IDX(j,i)]=sum;
							}
						}

					}
				}
			}
		} else
		{
			///generic Floyd's algorithm
			for(int k=0;k<n;++k)
			{
				for(j=0;j<n;++j)
				{
					for(i=j+1;i<n;++i)
					{
						const unsigned	sum=adj[IDX(i,k)]+adj[IDX(k,j)];
						if(adj[IDX(i,j)]>sum)
						{
							adj[IDX(i,j)]=adj[IDX(j,i)]=sum;
						}
					}
				}
			}
		}


		/* Build links	*/ 
		int	nlinks=0;
		for(j=0;j<n;++j)
		{
			for(i=j+1;i<n;++i)
			{
				if(adj[IDX(i,j)]==(unsigned)distance)
				{
					appendLink(i,j,mat);
					m_links[m_links.size()-1].m_bbending=1;
					++nlinks;
				}
			}
		}
		delete[] adj;		
		return(nlinks);
	}
	return(0);
}